

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

void __thiscall aiMaterial::Clear(aiMaterial *this)

{
  aiMaterialProperty *this_00;
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < this->mNumProperties; uVar1 = uVar1 + 1) {
    this_00 = this->mProperties[uVar1];
    if (this_00 != (aiMaterialProperty *)0x0) {
      aiMaterialProperty::~aiMaterialProperty(this_00);
    }
    operator_delete(this_00);
    this->mProperties[uVar1] = (aiMaterialProperty *)0x0;
  }
  this->mNumProperties = 0;
  return;
}

Assistant:

void aiMaterial::Clear()
{
    for ( unsigned int i = 0; i < mNumProperties; ++i )    {
        // delete this entry
        delete mProperties[ i ];
        AI_DEBUG_INVALIDATE_PTR(mProperties[i]);
    }
    mNumProperties = 0;

    // The array remains allocated, we just invalidated its contents
}